

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ExprInit(Fts5Global *pGlobal,sqlite3 *db)

{
  Fts5ExprFunc *p;
  void *pCtx;
  int rc;
  int i;
  Fts5ExprFunc aFunc [4];
  sqlite3 *db_local;
  Fts5Global *pGlobal_local;
  
  aFunc[3].x = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)db;
  memcpy(&rc,&PTR_anon_var_dwarf_1ad82_0025a440,0x40);
  pCtx._0_4_ = 0;
  for (pCtx._4_4_ = 0; (int)pCtx == 0 && pCtx._4_4_ < 4; pCtx._4_4_ = pCtx._4_4_ + 1) {
    pCtx._0_4_ = sqlite3_create_function
                           ((sqlite3 *)aFunc[3].x,*(char **)(&rc + (long)pCtx._4_4_ * 4),-1,1,
                            pGlobal,(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)
                                    aFunc[pCtx._4_4_].z,
                            (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                            (_func_void_sqlite3_context_ptr *)0x0);
  }
  return (int)pCtx;
}

Assistant:

static int sqlite3Fts5ExprInit(Fts5Global *pGlobal, sqlite3 *db){
  struct Fts5ExprFunc {
    const char *z;
    void (*x)(sqlite3_context*,int,sqlite3_value**);
  } aFunc[] = {
    { "fts5_expr",     fts5ExprFunctionHr },
    { "fts5_expr_tcl", fts5ExprFunctionTcl },
    { "fts5_isalnum",  fts5ExprIsAlnum },
    { "fts5_fold",     fts5ExprFold },
  };
  int i;
  int rc = SQLITE_OK;
  void *pCtx = (void*)pGlobal;

  for(i=0; rc==SQLITE_OK && i<ArraySize(aFunc); i++){
    struct Fts5ExprFunc *p = &aFunc[i];
    rc = sqlite3_create_function(db, p->z, -1, SQLITE_UTF8, pCtx, p->x, 0, 0);
  }

  /* Avoid warnings indicating that sqlite3Fts5ParserTrace() and
  ** sqlite3Fts5ParserFallback() are unused */
#ifndef NDEBUG
  (void)sqlite3Fts5ParserTrace;
#endif
  (void)sqlite3Fts5ParserFallback;

  return rc;
}